

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O0

void __thiscall
duckdb::RadixPartitionedHashTable::Sink
          (RadixPartitionedHashTable *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input,DataChunk *payload_input,unsafe_vector<idx_t> *filter)

{
  bool bVar1;
  RadixHTGlobalSinkState *size;
  RadixHTLocalSinkState *this_00;
  pointer pGVar2;
  type this_01;
  idx_t iVar3;
  atomic<bool> *this_02;
  atomic<bool> *paVar4;
  GroupedAggregateHashTable *pGVar5;
  GroupedAggregateHashTable *pGVar6;
  undefined8 *in_RSI;
  idx_t in_RDI;
  GroupedAggregateHashTable *in_R9;
  bool repartitioned;
  idx_t radix_bits_before;
  GroupedAggregateHashTable *ht;
  DataChunk *group_chunk;
  RadixHTLocalSinkState *lstate;
  RadixHTGlobalSinkState *gstate;
  RadixHTLocalSinkState *in_stack_000000e0;
  RadixHTGlobalSinkState *in_stack_000000e8;
  ClientContext *in_stack_000000f0;
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  *in_stack_ffffffffffffff68;
  GlobalSinkState *in_stack_ffffffffffffff70;
  DataChunk *in_stack_ffffffffffffff78;
  DataChunk *in_stack_ffffffffffffff80;
  GroupedAggregateHashTable *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  GroupedAggregateHashTable *in_stack_ffffffffffffffa0;
  GroupedAggregateHashTable *this_03;
  RadixPartitionedHashTable *in_stack_ffffffffffffffa8;
  RadixHTGlobalSinkState *gstate_00;
  DataChunk *in_stack_ffffffffffffffb8;
  
  size = GlobalSinkState::Cast<duckdb::RadixHTGlobalSinkState>(in_stack_ffffffffffffff70);
  this_00 = LocalSinkState::Cast<duckdb::RadixHTLocalSinkState>
                      ((LocalSinkState *)in_stack_ffffffffffffff70);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
                      *)0x7a392e);
  if (!bVar1) {
    this_00->local_sink_capacity = (size->config).sink_capacity;
    in_stack_ffffffffffffff80 = (DataChunk *)*in_RSI;
    in_stack_ffffffffffffff88 = (GroupedAggregateHashTable *)this_00->local_sink_capacity;
    RadixHTConfig::GetRadixBits((RadixHTConfig *)0x7a3980);
    CreateHT(in_stack_ffffffffffffffa8,(ClientContext *)in_stack_ffffffffffffffa0,
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),in_RDI);
    unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
    ::operator=((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
    ::~unique_ptr((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                   *)0x7a39b9);
    if (size->number_of_threads < 3) {
      this_00->adapted = true;
    }
    else {
      pGVar2 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
               ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                             *)in_stack_ffffffffffffff70);
      GroupedAggregateHashTable::EnableHLL(pGVar2,true);
    }
    ::std::__atomic_base<unsigned_long>::operator++
              (&(size->active_threads).super___atomic_base<unsigned_long>,0);
  }
  gstate_00 = (RadixHTGlobalSinkState *)&this_00->group_chunk;
  PopulateGroupChunk((RadixPartitionedHashTable *)this_00,in_stack_ffffffffffffffb8,
                     (DataChunk *)gstate_00);
  this_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
            ::operator*((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                         *)in_stack_ffffffffffffff70);
  GroupedAggregateHashTable::AddChunk
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (unsafe_vector<idx_t> *)in_stack_ffffffffffffff70);
  if ((this_00->adapted & 1U) == 0) {
    pGVar2 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
             ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                           *)in_stack_ffffffffffffff70);
    iVar3 = GroupedAggregateHashTable::GetSinkCount(pGVar2);
    if (0xfffff < iVar3) {
      DecideAdaptation(gstate_00,(RadixHTLocalSinkState *)this_01);
      GroupedAggregateHashTable::EnableHLL(this_01,false);
      this_00->adapted = true;
    }
  }
  iVar3 = GroupedAggregateHashTable::Count(this_01);
  this_02 = (atomic<bool> *)(iVar3 + 0x800);
  paVar4 = (atomic<bool> *)GroupedAggregateHashTable::ResizeThreshold(0x7a3ac2);
  if (paVar4 <= this_02) {
    if ((2 < size->number_of_threads) ||
       (bVar1 = ::std::atomic::operator_cast_to_bool(this_02), bVar1)) {
      GroupedAggregateHashTable::Abandon(in_stack_ffffffffffffffa0);
    }
    pGVar5 = (GroupedAggregateHashTable *)GroupedAggregateHashTable::GetRadixBits(this_01);
    MaybeRepartition(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    this_03 = pGVar5;
    pGVar6 = (GroupedAggregateHashTable *)GroupedAggregateHashTable::GetRadixBits(this_01);
    if ((pGVar5 != pGVar6) && (iVar3 = GroupedAggregateHashTable::Count(this_01), iVar3 != 0)) {
      GroupedAggregateHashTable::Abandon(this_03);
      bVar1 = ::std::atomic::operator_cast_to_bool(this_02);
      if (bVar1) {
        GroupedAggregateHashTable::Resize(in_R9,(idx_t)size);
      }
    }
  }
  return;
}

Assistant:

void RadixPartitionedHashTable::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input,
                                     DataChunk &payload_input, const unsafe_vector<idx_t> &filter) const {
	auto &gstate = input.global_state.Cast<RadixHTGlobalSinkState>();
	auto &lstate = input.local_state.Cast<RadixHTLocalSinkState>();
	if (!lstate.ht) {
		lstate.local_sink_capacity = gstate.config.sink_capacity;
		lstate.ht = CreateHT(context.client, lstate.local_sink_capacity, gstate.config.GetRadixBits());
		if (gstate.number_of_threads > RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD) {
			// Not using grow strategy, so we enable the HLL to potentially adapt later
			lstate.ht->EnableHLL(true);
		} else {
			// Using grow strategy, so won't ever adapt
			lstate.adapted = true;
		}
		gstate.active_threads++;
	}

	auto &group_chunk = lstate.group_chunk;
	PopulateGroupChunk(group_chunk, chunk);

	auto &ht = *lstate.ht;
	ht.AddChunk(group_chunk, payload_input, filter);

	// Decide whether we should adapt our strategy to the data
	if (!lstate.adapted && lstate.ht->GetSinkCount() >= RadixHTLocalSinkState::ADAPTIVITY_THRESHOLD) {
		DecideAdaptation(gstate, lstate);
		ht.EnableHLL(false); // Can be disabled now (costs 5-10% performance in worst case, single column distinct)
		lstate.adapted = true;
	}

	if (ht.Count() + STANDARD_VECTOR_SIZE < GroupedAggregateHashTable::ResizeThreshold(lstate.local_sink_capacity)) {
		return; // We can fit another chunk
	}

	if (gstate.number_of_threads > RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD || gstate.external) {
		// 'Reset' the HT without taking its data, we can just keep appending to the same collection
		// This only works because we never resize the HT
		// We don't do this when running with 1 or 2 threads, it only makes sense when there's many threads
		ht.Abandon();
	}

	// Check if we need to repartition
	const auto radix_bits_before = ht.GetRadixBits();
	MaybeRepartition(context.client, gstate, lstate);
	const auto repartitioned = radix_bits_before != ht.GetRadixBits();

	if (repartitioned && ht.Count() != 0) {
		// We repartitioned, but we didn't clear the pointer table / reset the count because we're on 1 or 2 threads
		ht.Abandon();
		if (gstate.external) {
			ht.Resize(lstate.local_sink_capacity);
		}
	}

	// TODO: combine early and often
}